

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O1

void __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNode
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  bool bVar1;
  Input rhs;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> local_38;
  
  rhs.data_.size_ = 4;
  rhs.data_.data_ = "U\x1d ";
  bVar1 = bssl::der::operator!=(policy,rhs);
  if (!bVar1) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x294,
                  "void bssl::(anonymous namespace)::ValidPolicyGraph::AddNode(der::Input, std::vector<der::Input>)"
                 );
  }
  local_38.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_start =
       (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_38.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_38.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>).
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AddNodeReturningIterator(this,policy,&local_38);
  if (local_38.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    return;
  }
  return;
}

Assistant:

void AddNode(der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    AddNodeReturningIterator(policy, std::move(parent_policies));
  }